

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O0

error_code
anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
          (fragment *f,generic_section *s)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  error __e;
  error_code eVar2;
  undefined1 local_38 [8];
  container<pstore::repo::internal_fixup> container;
  generic_section *s_local;
  fragment *f_local;
  error_category *local_10;
  
  container.end_ = (const_pointer)s;
  _local_38 = pstore::repo::generic_section::ifixups(s);
  __first = std::begin<pstore::repo::container<pstore::repo::internal_fixup>>
                      ((container<pstore::repo::internal_fixup> *)local_38);
  __last = std::end<pstore::repo::container<pstore::repo::internal_fixup>>
                     ((container<pstore::repo::internal_fixup> *)local_38);
  bVar1 = std::
          any_of<pstore::repo::internal_fixup_const*,(anonymous_namespace)::validate_section_ifixups<pstore::repo::generic_section>(pstore::repo::fragment_const&,pstore::repo::generic_section_const&)::_lambda(pstore::repo::internal_fixup_const&)_1_>
                    (__first,__last,(anon_class_8_1_54a39806_for__M_pred)f);
  __e = none;
  if (bVar1) {
    __e = internal_fixup_target_not_found;
  }
  std::error_code::error_code<pstore::exchange::import_ns::error,void>((error_code *)&f_local,__e);
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)f_local;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code validate_section_ifixups (pstore::repo::fragment const & f, Section const & s) {
        using pstore::exchange::import_ns::error;

        auto const container = s.ifixups ();
        return std::any_of (std::begin (container), std::end (container),
                            [&] (pstore::repo::internal_fixup const & ifx) {
                                return !f.has_section (ifx.section);
                            })
                   ? error::internal_fixup_target_not_found
                   : error::none;
    }